

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall DBOPL::Operator::Write20(Operator *this,Chip *chip,Bit8u val)

{
  byte bVar1;
  byte bVar2;
  
  if (this->reg20 != val) {
    bVar2 = this->reg20 ^ val;
    this->reg20 = val;
    this->tremoloMask = (char)val >> 7;
    bVar1 = val;
    if ((bVar2 & 0x10) != 0) {
      UpdateRates(this,chip);
      bVar1 = this->reg20;
    }
    this->rateZero = (this->releaseAdd == 0 | (bVar1 & 0x20) >> 5) << 2 | this->rateZero & 0xfb;
    if ((bVar2 & 0x4f) != 0) {
      this->freqMul = chip->freqMul[val & 0xf];
      UpdateFrequency(this);
      return;
    }
  }
  return;
}

Assistant:

void Operator::Write20( const Chip* chip, Bit8u val ) {
	Bit8u change = (reg20 ^ val );
	if ( !change )
		return;
	reg20 = val;
	//Shift the tremolo bit over the entire register, saved a branch, YES!
	tremoloMask = (Bit8s)(val) >> 7;
	tremoloMask &= ~(( 1 << ENV_EXTRA ) -1);
	//Update specific features based on changes
	if ( change & MASK_KSR ) {
		UpdateRates( chip );
	}
	//With sustain enable the volume doesn't change
	if ( reg20 & MASK_SUSTAIN || ( !releaseAdd ) ) {
		rateZero |= ( 1 << SUSTAIN );
	} else {
		rateZero &= ~( 1 << SUSTAIN );
	}
	//Frequency multiplier or vibrato changed
	if ( change & (0xf | MASK_VIBRATO) ) {
		freqMul = chip->freqMul[ val & 0xf ];
		UpdateFrequency();
	}
}